

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O3

bool __thiscall
cmQtAutoGenerator::InfoT::GetString(InfoT *this,string *key,string *value,bool required)

{
  bool bVar1;
  Value *this_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view message;
  string_view message_00;
  string local_80;
  String local_60;
  char *local_40;
  undefined8 local_38;
  
  this_00 = Json::Value::operator[](&this->Json_,key);
  bVar1 = Json::Value::isString(this_00);
  if (bVar1) {
    Json::Value::asString_abi_cxx11_(&local_60,this_00);
    std::__cxx11::string::operator=((string *)value,(string *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (!required || value->_M_string_length != 0) {
      return true;
    }
    local_60._M_string_length = (size_type)(key->_M_dataplus)._M_p;
    local_60._M_dataplus._M_p = (pointer)key->_M_string_length;
    local_60.field_2._M_allocated_capacity = 0;
    local_60.field_2._8_8_ = 10;
    local_40 = " is empty.";
    local_38 = 0;
    views._M_len = 2;
    views._M_array = (iterator)&local_60;
    cmCatViews(&local_80,views);
    message._M_str = local_80._M_dataplus._M_p;
    message._M_len = local_80._M_string_length;
    LogError(this,this->Gen_->GenType_,message);
  }
  else {
    bVar1 = Json::Value::isNull(this_00);
    if (bVar1 && !required) {
      return true;
    }
    local_60._M_string_length = (size_type)(key->_M_dataplus)._M_p;
    local_60._M_dataplus._M_p = (pointer)key->_M_string_length;
    local_60.field_2._M_allocated_capacity = 0;
    local_60.field_2._8_8_ = 0x11;
    local_40 = " is not a string.";
    local_38 = 0;
    views_00._M_len = 2;
    views_00._M_array = (iterator)&local_60;
    cmCatViews(&local_80,views_00);
    message_00._M_str = local_80._M_dataplus._M_p;
    message_00._M_len = local_80._M_string_length;
    LogError(this,this->Gen_->GenType_,message_00);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool cmQtAutoGenerator::InfoT::GetString(std::string const& key,
                                         std::string& value,
                                         bool required) const
{
  Json::Value const& jval = this->Json_[key];
  if (!jval.isString()) {
    if (!jval.isNull() || required) {
      return this->LogError(cmStrCat(key, " is not a string."));
    }
  } else {
    value = jval.asString();
    if (value.empty() && required) {
      return this->LogError(cmStrCat(key, " is empty."));
    }
  }
  return true;
}